

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImVec2 p_min;
  bool bVar1;
  byte bVar2;
  ImU32 IVar3;
  ImU32 fill_col;
  uint in_EDX;
  undefined8 in_RDI;
  float fVar4;
  float fVar5;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar6;
  float in_stack_0000003c;
  ImGuiDir in_stack_00000040;
  ImU32 in_stack_00000044;
  ImDrawList *in_stack_00000048;
  ImVec2 in_stack_00000050;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  float default_size;
  ImRect bb;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff50;
  ImGuiCol in_stack_ffffffffffffff54;
  ImRect *in_stack_ffffffffffffff58;
  ImGuiWindow *in_stack_ffffffffffffff60;
  ImRect *in_stack_ffffffffffffff68;
  ImVec2 *min;
  ImGuiButtonFlags flags_00;
  ImVec2 in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  float fVar7;
  ImRect local_44;
  ImGuiID local_34;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  uint local_20;
  undefined4 in_stack_fffffffffffffff0;
  float fStack_8;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  fVar5 = (float)in_XMM0_Qa;
  fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
  local_20 = in_EDX;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_34 = ImGuiWindow::GetID(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                                  (char *)CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50));
    min = &(local_28->DC).CursorPos;
    IVar6 = ::operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x361154);
    fVar7 = IVar6.x;
    ImRect::ImRect(&local_44,min,(ImVec2 *)&stack0xffffffffffffffb4);
    flags_00 = (ImGuiButtonFlags)((ulong)min >> 0x20);
    fVar4 = GetFrameHeight();
    ItemSize((ImVec2 *)in_stack_ffffffffffffff60,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    bVar1 = ItemAdd(in_stack_ffffffffffffff68,(ImGuiID)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                    in_stack_ffffffffffffff58);
    if (bVar1) {
      if (((local_28->DC).ItemFlags & 2U) != 0) {
        local_20 = local_20 | 0x400;
      }
      bVar2 = ButtonBehavior(in_stack_ffffffffffffff98,id_00,in_stack_ffffffffffffff88,
                             (bool *)in_stack_ffffffffffffff80,flags_00);
      IVar3 = GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      fill_col = GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      RenderNavHighlight((ImRect *)CONCAT44(fVar5,in_stack_fffffffffffffff0),
                         (ImGuiID)((ulong)in_RDI >> 0x20),(ImGuiNavHighlightFlags)in_RDI);
      p_min.y = fVar7;
      p_min.x = fVar4;
      IVar6.y._0_1_ = in_stack_ffffffffffffffac;
      IVar6.x = (float)IVar3;
      IVar6.y._1_1_ = bVar2;
      IVar6.y._2_1_ = in_stack_ffffffffffffffae;
      IVar6.y._3_1_ = in_stack_ffffffffffffffaf;
      RenderFrame(p_min,IVar6,fill_col,(bool)in_stack_ffffffffffffffa3,local_44.Min.y);
      fVar4 = 0.0;
      fVar5 = ImMax<float>(0.0,(fVar5 - local_30->FontSize) * 0.5);
      fVar4 = ImMax<float>(fVar4,(fStack_8 - local_30->FontSize) * 0.5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,fVar5,fVar4);
      ::operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x3613ba);
      RenderArrow(in_stack_00000048,in_stack_00000050,in_stack_00000044,in_stack_00000040,
                  in_stack_0000003c);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}